

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprite.cpp
# Opt level: O1

void __thiscall sf::Sprite::Sprite(Sprite *this,Texture *texture,IntRect *rectangle)

{
  long lVar1;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_0022b870;
  Transformable::Transformable(&this->super_Transformable);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Sprite_0022b7e0;
  (this->super_Transformable)._vptr_Transformable = (_func_int **)&PTR__Sprite_0022b808;
  lVar1 = 0xb4;
  do {
    Vertex::Vertex((Vertex *)
                   ((long)(this->super_Transformable).m_transform.m_matrix + lVar1 + -0x2c));
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0x104);
  this->m_texture = (Texture *)0x0;
  (this->m_textureRect).left = 0;
  (this->m_textureRect).top = 0;
  (this->m_textureRect).width = 0;
  (this->m_textureRect).height = 0;
  setTexture(this,texture,false);
  setTextureRect(this,rectangle);
  return;
}

Assistant:

Sprite::Sprite(const Texture& texture, const IntRect& rectangle) :
m_texture    (NULL),
m_textureRect()
{
    setTexture(texture);
    setTextureRect(rectangle);
}